

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O1

void __thiscall GLFlat::ProcessLights(GLFlat *this,bool istrans)

{
  uint uVar1;
  sector_t *psVar2;
  long lVar3;
  undefined8 *puVar4;
  
  this->dynlightindex = (GLRenderer->mLights->mIndices).Count;
  psVar2 = this->sector;
  if (0 < psVar2->subsectorcount) {
    lVar3 = 0;
    do {
      if (((gl_drawinfo->ss_renderflags).Array
           [((long)psVar2->subsectors[lVar3] - (long)subsectors >> 5) * -0x5555555555555555] &
          this->renderflags) != 0 || istrans) {
        SetupSubsectorLights(this,1,psVar2->subsectors[lVar3],(int *)0x0);
      }
      lVar3 = lVar3 + 1;
      psVar2 = this->sector;
    } while (lVar3 < psVar2->subsectorcount);
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      lVar3 = 0x98;
      uVar1 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar3 = 0x88;
      uVar1 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if ((uint)psVar2->sectornum < uVar1) {
      puVar4 = *(undefined8 **)
                (*(long *)(&gl_drawinfo->temporary + lVar3) + (ulong)(uint)psVar2->sectornum * 8);
    }
    else {
      puVar4 = (undefined8 *)0x0;
    }
    for (; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
      SetupSubsectorLights(this,1,(subsector_t *)puVar4[1],(int *)0x0);
    }
    return;
  }
  return;
}

Assistant:

void GLFlat::ProcessLights(bool istrans)
{
	dynlightindex = GLRenderer->mLights->GetIndexPtr();

	// Draw the subsectors belonging to this sector
	for (int i=0; i<sector->subsectorcount; i++)
	{
		subsector_t * sub = sector->subsectors[i];
		if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
		{
			SetupSubsectorLights(GLPASS_LIGHTSONLY, sub);
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			SetupSubsectorLights(GLPASS_LIGHTSONLY, node->sub);
			node = node->next;
		}
	}
}